

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit_library.cpp
# Opt level: O0

ModelCircuit * __thiscall
lsim::ModelCircuitLibrary::create_circuit(ModelCircuitLibrary *this,char *name,LSimContext *context)

{
  LSimContext *pLVar1;
  reference this_00;
  pointer pMVar2;
  mapped_type *ppMVar3;
  allocator local_69;
  string local_68 [32];
  pointer local_48;
  pointer circuit;
  ModelCircuitLibrary *local_30;
  value_type local_28;
  LSimContext *local_20;
  LSimContext *context_local;
  char *name_local;
  ModelCircuitLibrary *this_local;
  
  local_20 = context;
  context_local = (LSimContext *)name;
  name_local = (char *)this;
  if (name != (char *)0x0) {
    local_30 = this;
    std::make_unique<lsim::ModelCircuit,char_const*&,lsim::LSimContext*&,lsim::ModelCircuitLibrary*>
              ((char **)&local_28,&context_local,(ModelCircuitLibrary **)&local_20);
    std::
    vector<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
    ::push_back(&this->m_circuits,&local_28);
    std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>::~unique_ptr
              (&local_28);
    this_00 = std::
              vector<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
              ::back(&this->m_circuits);
    pMVar2 = std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>::get
                       (this_00);
    pLVar1 = context_local;
    local_48 = pMVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,(char *)pLVar1,&local_69);
    ppMVar3 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lsim::ModelCircuit_*>_>_>
              ::operator[](&this->m_circuit_lut,(key_type *)local_68);
    *ppMVar3 = pMVar2;
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    return local_48;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_circuit_library.cpp"
                ,0x11,
                "ModelCircuit *lsim::ModelCircuitLibrary::create_circuit(const char *, LSimContext *)"
               );
}

Assistant:

ModelCircuit *ModelCircuitLibrary::create_circuit(const char *name, LSimContext *context) {
    assert(name);

    m_circuits.push_back(std::make_unique<ModelCircuit>(name, context, this));
    auto circuit = m_circuits.back().get();
    m_circuit_lut[name] = circuit;

    return circuit;
}